

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross_containers.hpp
# Opt level: O0

void __thiscall
diligent_spirv_cross::
SmallVector<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)3>,_8UL>::SmallVector
          (SmallVector<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)3>,_8UL> *this)

{
  TypedID<(diligent_spirv_cross::Types)3> *pTVar1;
  SmallVector<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)3>,_8UL> *this_local;
  
  VectorView<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)3>_>::VectorView
            (&this->super_VectorView<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)3>_>
            );
  this->buffer_capacity = 0;
  pTVar1 = AlignedBuffer<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)3>,_8UL>::data
                     (&this->stack_storage);
  (this->super_VectorView<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)3>_>).ptr =
       pTVar1;
  this->buffer_capacity = 8;
  return;
}

Assistant:

SmallVector() SPIRV_CROSS_NOEXCEPT
	{
		this->ptr = stack_storage.data();
		buffer_capacity = N;
	}